

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_sse4.c
# Opt level: O2

void filter_src_pixels(__m128i src,__m128i *tmp,__m128i *coeff,int offset_bits_horiz,
                      int reduce_bits_horiz,int k)

{
  ushort *puVar1;
  short sVar2;
  short sVar5;
  undefined1 in_XMM0 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar10 = pshufb(in_XMM0,_DAT_004c20b0);
  auVar3 = pshufb(in_XMM0,_DAT_004c20c0);
  auVar4._0_8_ = auVar3._0_8_;
  auVar7._0_8_ = auVar10._0_8_;
  auVar7._8_8_ = auVar4._0_8_;
  auVar7 = pmaddubsw(auVar7,*(undefined1 (*) [16])src[1]);
  auVar8._0_8_ = auVar10._4_8_;
  auVar8._8_4_ = auVar3._4_4_;
  auVar8._12_4_ = auVar3._8_4_;
  auVar9 = pmaddubsw(auVar8,*(undefined1 (*) [16])(src[1] + 0x10));
  auVar4._8_8_ = auVar10._2_8_;
  auVar4 = pmaddubsw(auVar4,*(undefined1 (*) [16])(src[1] + 0x20));
  auVar3._0_8_ = auVar3._4_8_;
  auVar3._8_8_ = auVar10._6_8_;
  auVar8 = pmaddubsw(auVar3,*(undefined1 (*) [16])(src[1] + 0x30));
  auVar3 = ZEXT416(((uint)(1 << ((byte)tmp & 0x1f)) >> 1) + 0x4000);
  auVar3 = pshuflw(auVar3,auVar3,0);
  sVar2 = auVar3._0_2_;
  sVar5 = auVar3._2_2_;
  uVar6 = (ulong)tmp & 0xffffffff;
  puVar1 = (ushort *)(src[0] + 0x70 + (long)(int)coeff * 0x10);
  *puVar1 = (ushort)(sVar2 + auVar7._0_2_ + auVar9._0_2_ + auVar8._0_2_ + auVar4._0_2_) >> uVar6;
  puVar1[1] = (ushort)(sVar5 + auVar7._2_2_ + auVar9._2_2_ + auVar8._2_2_ + auVar4._2_2_) >> uVar6;
  puVar1[2] = (ushort)(sVar2 + auVar7._4_2_ + auVar9._4_2_ + auVar8._4_2_ + auVar4._4_2_) >> uVar6;
  puVar1[3] = (ushort)(sVar5 + auVar7._6_2_ + auVar9._6_2_ + auVar8._6_2_ + auVar4._6_2_) >> uVar6;
  puVar1[4] = (ushort)(sVar2 + auVar7._8_2_ + auVar9._8_2_ + auVar8._8_2_ + auVar4._8_2_) >> uVar6;
  puVar1[5] = (ushort)(sVar5 + auVar7._10_2_ + auVar9._10_2_ + auVar8._10_2_ + auVar4._10_2_) >>
              uVar6;
  puVar1[6] = (ushort)(sVar2 + auVar7._12_2_ + auVar9._12_2_ + auVar8._12_2_ + auVar4._12_2_) >>
              uVar6;
  puVar1[7] = (ushort)(sVar5 + auVar7._14_2_ + auVar9._14_2_ + auVar8._14_2_ + auVar4._14_2_) >>
              uVar6;
  return;
}

Assistant:

static inline void filter_src_pixels(__m128i src, __m128i *tmp, __m128i *coeff,
                                     const int offset_bits_horiz,
                                     const int reduce_bits_horiz, int k) {
  const __m128i src_even =
      _mm_shuffle_epi8(src, _mm_load_si128((__m128i *)even_mask));
  const __m128i src_odd =
      _mm_shuffle_epi8(src, _mm_load_si128((__m128i *)odd_mask));
  // The pixel order we need for 'src' is:
  // 0 2 2 4 4 6 6 8 1 3 3 5 5 7 7 9
  const __m128i src_02 = _mm_unpacklo_epi64(src_even, src_odd);
  const __m128i res_02 = _mm_maddubs_epi16(src_02, coeff[0]);
  // 4 6 6 8 8 10 10 12 5 7 7 9 9 11 11 13
  const __m128i src_46 = _mm_unpacklo_epi64(_mm_srli_si128(src_even, 4),
                                            _mm_srli_si128(src_odd, 4));
  const __m128i res_46 = _mm_maddubs_epi16(src_46, coeff[1]);
  // 1 3 3 5 5 7 7 9 2 4 4 6 6 8 8 10
  const __m128i src_13 =
      _mm_unpacklo_epi64(src_odd, _mm_srli_si128(src_even, 2));
  const __m128i res_13 = _mm_maddubs_epi16(src_13, coeff[2]);
  // 5 7 7 9 9 11 11 13 6 8 8 10 10 12 12 14
  const __m128i src_57 = _mm_unpacklo_epi64(_mm_srli_si128(src_odd, 4),
                                            _mm_srli_si128(src_even, 6));
  const __m128i res_57 = _mm_maddubs_epi16(src_57, coeff[3]);

  const __m128i round_const = _mm_set1_epi16((1 << offset_bits_horiz) +
                                             ((1 << reduce_bits_horiz) >> 1));

  // Note: The values res_02 + res_46 and res_13 + res_57 both
  // fit into int16s at this point, but their sum may be too wide to fit
  // into an int16. However, once we also add round_const, the sum of
  // all of these fits into a uint16.
  //
  // The wrapping behaviour of _mm_add_* is used here to make sure we
  // get the correct result despite converting between different
  // (implicit) types.
  const __m128i res_even = _mm_add_epi16(res_02, res_46);
  const __m128i res_odd = _mm_add_epi16(res_13, res_57);
  const __m128i res =
      _mm_add_epi16(_mm_add_epi16(res_even, res_odd), round_const);
  tmp[k + 7] = _mm_srl_epi16(res, _mm_cvtsi32_si128(reduce_bits_horiz));
}